

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_cost_test.cc
# Opt level: O3

void anon_unknown.dwarf_245ae48::TestMvComponentCostTable(MvSubpelPrecision precision)

{
  undefined8 *puVar1;
  bool bVar2;
  void *pvVar3;
  void *pvVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  int *mvcost;
  ulong uVar9;
  AssertHelper *pAVar10;
  int iVar11;
  uint uVar12;
  SEARCH_METHODS *pSVar13;
  uint uVar14;
  bool bVar15;
  aom_cdf_prob *cdf;
  int *lhs;
  long lVar16;
  ulong uVar17;
  int *lhs_00;
  int sign_cost [2];
  int class0_fp_cost [2] [4];
  int class_cost [11];
  int hp_cost [2];
  int class0_hp_cost [2];
  int class0_cost [2];
  int bits_cost [10] [2];
  int fp_cost [4];
  int local_110;
  int local_10c;
  AssertHelper local_108 [4];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8 [7];
  int local_b0 [2];
  int local_a8 [2];
  int local_a0 [2];
  internal local_98 [8];
  undefined8 *local_90;
  AssertHelper local_48 [3];
  
  pvVar3 = operator_new__(0x1fffc);
  pvVar4 = operator_new__(0x1fffc);
  av1_cost_tokens_from_cdf
            (&local_110,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x36),
             (int *)0x0);
  av1_cost_tokens_from_cdf
            ((int *)local_e8,(aom_cdf_prob *)(anonymous_namespace)::kTestComponentContext,(int *)0x0
            );
  av1_cost_tokens_from_cdf
            (local_a0,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x48),
             (int *)0x0);
  lhs = (int *)((long)pvVar3 + 0xfffc);
  mvcost = (int *)((long)pvVar4 + 0xfffc);
  cdf = (aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x4e);
  lVar16 = 0;
  do {
    av1_cost_tokens_from_cdf((int *)(local_98 + lVar16),cdf,(int *)0x0);
    lVar16 = lVar16 + 8;
    cdf = cdf + 3;
  } while (lVar16 != 0x50);
  lVar16 = 0;
  pAVar10 = local_108;
  bVar2 = true;
  do {
    bVar15 = bVar2;
    av1_cost_tokens_from_cdf
              ((int *)pAVar10,
               (aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + lVar16 * 10 + 0x18),
               (int *)0x0);
    lVar16 = 1;
    pAVar10 = local_108 + 2;
    bVar2 = false;
  } while (bVar15);
  av1_cost_tokens_from_cdf
            ((int *)local_48,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x2c),
             (int *)0x0);
  if ('\0' < precision) {
    av1_cost_tokens_from_cdf
              (local_a8,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x3c),
               (int *)0x0);
    av1_cost_tokens_from_cdf
              (local_b0,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x42),
               (int *)0x0);
  }
  *lhs = 0;
  uVar9 = 1;
  do {
    uVar14 = (int)uVar9 - 1;
    uVar6 = 0x1f;
    if ((int)uVar14 >> 3 != 0) {
      for (; (uint)((int)uVar14 >> 3) >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    if (uVar9 < 9) {
      uVar6 = 0;
    }
    bVar5 = (byte)uVar6;
    iVar11 = -8 << (bVar5 & 0x1f);
    if (bVar5 == 0) {
      iVar11 = 0;
    }
    uVar12 = iVar11 + (int)uVar9 + -1 >> 3;
    uVar17 = (ulong)(uVar6 & 0xff);
    iVar11 = *(int *)((long)&local_e8[0]._M_head_impl + uVar17 * 4);
    if (bVar5 == 0) {
      iVar11 = iVar11 + local_a0[(int)uVar12];
    }
    else {
      uVar7 = 0;
      do {
        iVar11 = iVar11 + *(int *)(local_98 +
                                  uVar7 * 8 + (ulong)((uVar12 >> ((uint)uVar7 & 0x1f) & 1) != 0) * 4
                                  );
        uVar7 = uVar7 + 1;
      } while (uVar17 != uVar7);
    }
    if (-1 < precision) {
      pAVar10 = local_108 + (long)(int)uVar12 * 2;
      if (uVar17 != 0) {
        pAVar10 = local_48;
      }
      iVar11 = iVar11 + *(int *)((long)&pAVar10->data_ + (ulong)(uVar14 >> 1 & 3) * 4);
      if ('\0' < precision) {
        piVar8 = local_b0;
        if (uVar17 == 0) {
          piVar8 = local_a8;
        }
        iVar11 = iVar11 + piVar8[uVar14 & 1];
      }
    }
    lhs[uVar9] = iVar11 + local_110;
    lhs[-uVar9] = iVar11 + local_10c;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x4000);
  av1_build_nmv_component_cost_table
            (mvcost,(nmv_component *)(anonymous_namespace)::kTestComponentContext,precision);
  lVar16 = 0;
  piVar8 = mvcost;
  lhs_00 = lhs;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_98,"mvcost_ref[v]","mvcost[v]",lhs,mvcost);
    puVar1 = local_90;
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_e8[0]._M_head_impl + 0x10),"v = ",4);
      std::ostream::operator<<(local_e8[0]._M_head_impl + 0x10,(int)lVar16);
      if (local_90 == (undefined8 *)0x0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = (SEARCH_METHODS *)*local_90;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/mv_cost_test.cc"
                 ,0x6c,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(local_108,(Message *)local_e8);
LAB_00765bbf:
      testing::internal::AssertHelper::~AssertHelper(local_108);
      if (local_e8[0]._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8[0]._M_head_impl + 8))();
      }
      if (local_90 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_90 != local_90 + 2) {
          operator_delete((undefined8 *)*local_90);
        }
        operator_delete(local_90);
      }
      break;
    }
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<int,int>(local_98,"mvcost_ref[-v]","mvcost[-v]",lhs_00,piVar8);
    puVar1 = local_90;
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_e8[0]._M_head_impl + 0x10),"v = ",4);
      std::ostream::operator<<(local_e8[0]._M_head_impl + 0x10,(int)lVar16);
      if (local_90 == (undefined8 *)0x0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = (SEARCH_METHODS *)*local_90;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/mv_cost_test.cc"
                 ,0x6d,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(local_108,(Message *)local_e8);
      goto LAB_00765bbf;
    }
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar1);
    }
    lVar16 = lVar16 + 1;
    lhs_00 = lhs_00 + -1;
    piVar8 = piVar8 + -1;
    mvcost = mvcost + 1;
    lhs = lhs + 1;
  } while (lVar16 != 0x4000);
  operator_delete__(pvVar4);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void TestMvComponentCostTable(MvSubpelPrecision precision) {
  std::unique_ptr<int[]> mvcost_ref_buf(new int[MV_VALS]);
  std::unique_ptr<int[]> mvcost_buf(new int[MV_VALS]);
  int *mvcost_ref = mvcost_ref_buf.get() + MV_MAX;
  int *mvcost = mvcost_buf.get() + MV_MAX;

  ReferenceBuildNmvComponentCostTable(mvcost_ref, &kTestComponentContext,
                                      precision);
  av1_build_nmv_component_cost_table(mvcost, &kTestComponentContext, precision);

  for (int v = 0; v <= MV_MAX; ++v) {
    ASSERT_EQ(mvcost_ref[v], mvcost[v]) << "v = " << v;
    ASSERT_EQ(mvcost_ref[-v], mvcost[-v]) << "v = " << v;
  }
}